

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# altrace_record.c
# Opt level: O2

void alDeleteBuffers(ALsizei n,ALuint *names)

{
  uint name;
  BufferWrapper *pBVar1;
  ALenum AVar2;
  BufferWrapper *__ptr;
  BufferWrapper **ppBVar3;
  ulong uVar4;
  ulong uVar5;
  DeviceWrapper *pDVar6;
  
  uVar5 = 0;
  if (current_context == (ContextWrapper *)0x0) {
    pDVar6 = (DeviceWrapper *)0x0;
  }
  else {
    pDVar6 = current_context->device;
  }
  APILOCK();
  IO_ENTRYINFO(ALEE_alDeleteBuffers);
  IO_ALSIZEI(n);
  IO_UINT64((uint64)names);
  uVar4 = 0;
  if (0 < n) {
    uVar4 = (ulong)(uint)n;
  }
  for (; uVar4 != uVar5; uVar5 = uVar5 + 1) {
    writele32(names[uVar5]);
  }
  (*REAL_alDeleteBuffers)(n,names);
  AVar2 = check_al_error_events();
  if (pDVar6 != (DeviceWrapper *)0x0 && AVar2 == 0) {
    for (uVar5 = 0; uVar4 != uVar5; uVar5 = uVar5 + 1) {
      name = names[uVar5];
      __ptr = buffer_wrapped_lookup(name);
      if (__ptr != (BufferWrapper *)0x0) {
        pBVar1 = __ptr->hash_next;
        ppBVar3 = pDVar6->wrapped_buffer_hash + (name & 0xff);
        if (__ptr->hash_prev != (BufferWrapper *)0x0) {
          ppBVar3 = &__ptr->hash_prev->hash_next;
        }
        *ppBVar3 = pBVar1;
        if (pBVar1 != (BufferWrapper *)0x0) {
          pBVar1->hash_prev = __ptr->hash_prev;
        }
        free(__ptr);
      }
    }
  }
  check_al_error_events();
  check_al_async_states();
  APIUNLOCK();
  return;
}

Assistant:

void alDeleteBuffers(ALsizei n, const ALuint *names)
{
    DeviceWrapper *device = current_context ? current_context->device : NULL;
    ALsizei i;

    IO_START(alDeleteBuffers);
    IO_ALSIZEI(n);
    IO_PTR(names);
    for (i = 0; i < n; i++) {
        IO_UINT32(names[i]);
    }

    REAL_alDeleteBuffers(n, names);

    // objects are only deleted if there are no errors.
    if (check_al_error_events() == AL_NO_ERROR) {
        if (device) {
            for (i = 0; i < n; i++) {
                const ALuint name = names[i];
                BufferWrapper *buf = buffer_wrapped_lookup(name);
                if (buf) {
                    if (buf->hash_prev) {
                        buf->hash_prev->hash_next = buf->hash_next;
                    } else {
                        device->wrapped_buffer_hash[hash_alname(name)] = buf->hash_next;
                    }
                    if (buf->hash_next) {
                        buf->hash_next->hash_prev = buf->hash_prev;
                    }
                    free(buf);
                }
            }
        }
    }

    IO_END();
}